

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall
ObjectModelBuilder::buildMaybeReplicator(ObjectModelBuilder *this,value *value,Class *clazz)

{
  bool bVar1;
  ostream *poVar2;
  object *object;
  Class *clazz_local;
  value *value_local;
  ObjectModelBuilder *this_local;
  
  bVar1 = picojson::value::
          is<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                    (value);
  if (bVar1) {
    object = picojson::value::
             get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                       (value);
    this_local._7_1_ = buildReplicator(this,object,clazz);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: \'replicator\' in class=");
    poVar2 = std::operator<<(poVar2,(string *)clazz);
    poVar2 = std::operator<<(poVar2," is no a JSON object");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ObjectModelBuilder::buildMaybeReplicator(const picojson::value &value, Class *clazz)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: 'replicator' in class=" << clazz->name << " is no a JSON object" << std::endl;
        return false;
    }

    return buildReplicator(value.get<picojson::object>(), clazz);
}